

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void fe_loose_invert(fe *out,fe_loose *z)

{
  int local_bc;
  undefined1 local_b8 [4];
  int i;
  fe t3;
  fe t2;
  fe t1;
  fe t0;
  fe_loose *z_local;
  fe *out_local;
  
  fe_sq_tl((fe *)(t1.v + 4),z);
  fe_sq_tt((fe *)(t2.v + 4),(fe *)(t1.v + 4));
  for (local_bc = 1; local_bc < 2; local_bc = local_bc + 1) {
    fe_sq_tt((fe *)(t2.v + 4),(fe *)(t2.v + 4));
  }
  fe_mul_tlt((fe *)(t2.v + 4),z,(fe *)(t2.v + 4));
  fe_mul_ttt((fe *)(t1.v + 4),(fe *)(t1.v + 4),(fe *)(t2.v + 4));
  fe_sq_tt((fe *)(t3.v + 4),(fe *)(t1.v + 4));
  fe_mul_ttt((fe *)(t2.v + 4),(fe *)(t2.v + 4),(fe *)(t3.v + 4));
  fe_sq_tt((fe *)(t3.v + 4),(fe *)(t2.v + 4));
  for (local_bc = 1; local_bc < 5; local_bc = local_bc + 1) {
    fe_sq_tt((fe *)(t3.v + 4),(fe *)(t3.v + 4));
  }
  fe_mul_ttt((fe *)(t2.v + 4),(fe *)(t3.v + 4),(fe *)(t2.v + 4));
  fe_sq_tt((fe *)(t3.v + 4),(fe *)(t2.v + 4));
  for (local_bc = 1; local_bc < 10; local_bc = local_bc + 1) {
    fe_sq_tt((fe *)(t3.v + 4),(fe *)(t3.v + 4));
  }
  fe_mul_ttt((fe *)(t3.v + 4),(fe *)(t3.v + 4),(fe *)(t2.v + 4));
  fe_sq_tt((fe *)local_b8,(fe *)(t3.v + 4));
  for (local_bc = 1; local_bc < 0x14; local_bc = local_bc + 1) {
    fe_sq_tt((fe *)local_b8,(fe *)local_b8);
  }
  fe_mul_ttt((fe *)(t3.v + 4),(fe *)local_b8,(fe *)(t3.v + 4));
  fe_sq_tt((fe *)(t3.v + 4),(fe *)(t3.v + 4));
  for (local_bc = 1; local_bc < 10; local_bc = local_bc + 1) {
    fe_sq_tt((fe *)(t3.v + 4),(fe *)(t3.v + 4));
  }
  fe_mul_ttt((fe *)(t2.v + 4),(fe *)(t3.v + 4),(fe *)(t2.v + 4));
  fe_sq_tt((fe *)(t3.v + 4),(fe *)(t2.v + 4));
  for (local_bc = 1; local_bc < 0x32; local_bc = local_bc + 1) {
    fe_sq_tt((fe *)(t3.v + 4),(fe *)(t3.v + 4));
  }
  fe_mul_ttt((fe *)(t3.v + 4),(fe *)(t3.v + 4),(fe *)(t2.v + 4));
  fe_sq_tt((fe *)local_b8,(fe *)(t3.v + 4));
  for (local_bc = 1; local_bc < 100; local_bc = local_bc + 1) {
    fe_sq_tt((fe *)local_b8,(fe *)local_b8);
  }
  fe_mul_ttt((fe *)(t3.v + 4),(fe *)local_b8,(fe *)(t3.v + 4));
  fe_sq_tt((fe *)(t3.v + 4),(fe *)(t3.v + 4));
  for (local_bc = 1; local_bc < 0x32; local_bc = local_bc + 1) {
    fe_sq_tt((fe *)(t3.v + 4),(fe *)(t3.v + 4));
  }
  fe_mul_ttt((fe *)(t2.v + 4),(fe *)(t3.v + 4),(fe *)(t2.v + 4));
  fe_sq_tt((fe *)(t2.v + 4),(fe *)(t2.v + 4));
  for (local_bc = 1; local_bc < 5; local_bc = local_bc + 1) {
    fe_sq_tt((fe *)(t2.v + 4),(fe *)(t2.v + 4));
  }
  fe_mul_ttt(out,(fe *)(t2.v + 4),(fe *)(t1.v + 4));
  return;
}

Assistant:

static void fe_loose_invert(fe *out, const fe_loose *z) {
  fe t0;
  fe t1;
  fe t2;
  fe t3;
  int i;

  fe_sq_tl(&t0, z);
  fe_sq_tt(&t1, &t0);
  for (i = 1; i < 2; ++i) {
    fe_sq_tt(&t1, &t1);
  }
  fe_mul_tlt(&t1, z, &t1);
  fe_mul_ttt(&t0, &t0, &t1);
  fe_sq_tt(&t2, &t0);
  fe_mul_ttt(&t1, &t1, &t2);
  fe_sq_tt(&t2, &t1);
  for (i = 1; i < 5; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t1, &t2, &t1);
  fe_sq_tt(&t2, &t1);
  for (i = 1; i < 10; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t2, &t2, &t1);
  fe_sq_tt(&t3, &t2);
  for (i = 1; i < 20; ++i) {
    fe_sq_tt(&t3, &t3);
  }
  fe_mul_ttt(&t2, &t3, &t2);
  fe_sq_tt(&t2, &t2);
  for (i = 1; i < 10; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t1, &t2, &t1);
  fe_sq_tt(&t2, &t1);
  for (i = 1; i < 50; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t2, &t2, &t1);
  fe_sq_tt(&t3, &t2);
  for (i = 1; i < 100; ++i) {
    fe_sq_tt(&t3, &t3);
  }
  fe_mul_ttt(&t2, &t3, &t2);
  fe_sq_tt(&t2, &t2);
  for (i = 1; i < 50; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t1, &t2, &t1);
  fe_sq_tt(&t1, &t1);
  for (i = 1; i < 5; ++i) {
    fe_sq_tt(&t1, &t1);
  }
  fe_mul_ttt(out, &t1, &t0);
}